

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

int __thiscall
QOpenGLTexturePrivate::bind(QOpenGLTexturePrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long in_FS_OFFSET;
  GLint oldTextureUnit;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  if ((int)__addr == 0) {
    (**(code **)(*(long *)this->functions + 200))(0x84e0,&local_24);
  }
  (*this->texFuncs->ActiveTexture)(__fd + 0x84c0);
  (*(code *)**(undefined8 **)this->functions)(this->target,this->textureId);
  if ((int)__addr == 0) {
    (*this->texFuncs->ActiveTexture)(local_24 + 0x84c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexturePrivate::bind(uint unit, QOpenGLTexture::TextureUnitReset reset)
{
    GLint oldTextureUnit = 0;
    if (reset == QOpenGLTexture::ResetTextureUnit)
        functions->glGetIntegerv(GL_ACTIVE_TEXTURE, &oldTextureUnit);

    texFuncs->glActiveTexture(GL_TEXTURE0 + unit);
    functions->glBindTexture(target, textureId);

    if (reset == QOpenGLTexture::ResetTextureUnit)
        texFuncs->glActiveTexture(GL_TEXTURE0 + oldTextureUnit);
}